

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O1

int matchreg(match *res,reg *reg,easm_expr *expr,iasctx *ctx)

{
  sreg *psVar1;
  char *__s;
  anon_enum_32 in_EAX;
  int iVar2;
  uint uVar3;
  ulong uVar4;
  size_t sVar5;
  ull num;
  char *pcVar6;
  char *end;
  byte *local_38;
  
  psVar1 = reg->specials;
  if (psVar1 != (sreg *)0x0) {
    iVar2 = psVar1->num;
    while (iVar2 != -1) {
      in_EAX = psVar1->fmask;
      if ((in_EAX == SR_NAMED) || ((in_EAX & ~*ctx->varinfo->fmask) == SR_NAMED)) {
        in_EAX = psVar1->mode;
        uVar4 = (ulong)in_EAX;
        if (uVar4 < 4) {
          in_EAX = (&switchD_00244696::switchdataD_0024e69c)[uVar4] + 0x24e69c;
          switch(uVar4) {
          case 0:
            if ((expr->type == EASM_EXPR_REG) &&
               (in_EAX = strcmp(expr->str,psVar1->name), in_EAX == SR_NAMED)) {
LAB_002446ea:
              in_EAX = setbf(res,reg->bf,(long)iVar2);
              goto LAB_002446fe;
            }
            break;
          case 1:
            if ((expr->type == EASM_EXPR_NUM) && (expr->num == 0)) goto LAB_002446ea;
            break;
          case 2:
            if ((expr->type == EASM_EXPR_NUM) && (expr->num == 1)) goto LAB_002446ea;
            break;
          case 3:
            if (expr->type == EASM_EXPR_DISCARD) goto LAB_002446ea;
          }
        }
      }
      iVar2 = psVar1[1].num;
      psVar1 = psVar1 + 1;
    }
LAB_002446fe:
    if (iVar2 != -1) {
      return in_EAX;
    }
  }
  uVar3 = 0;
  if (expr->type == EASM_EXPR_REG) {
    pcVar6 = expr->str;
    __s = reg->name;
    sVar5 = strlen(__s);
    iVar2 = strncmp(pcVar6,__s,sVar5);
    if (iVar2 == 0) {
      num = strtoull(pcVar6 + sVar5,(char **)&local_38,10);
      if (reg->hilo == 0) {
        pcVar6 = "";
        if (reg->suffix != (char *)0x0) {
          pcVar6 = reg->suffix;
        }
        iVar2 = strcmp((char *)local_38,pcVar6);
        if (iVar2 != 0) {
          return 0;
        }
      }
      else {
        sVar5 = strlen((char *)local_38);
        if (sVar5 != 1) {
          return 0;
        }
        if ((*local_38 | 4) != 0x6c) {
          return 0;
        }
        num = (ulong)(*local_38 == 0x68) + num * 2;
      }
      if (reg->bf == (bitfield *)0x0) {
        uVar3 = (uint)(num == 0);
      }
      else {
        uVar3 = setbf(res,reg->bf,num);
      }
    }
  }
  return uVar3;
}

Assistant:

int matchreg (struct match *res, const struct reg *reg, const struct easm_expr *expr, struct iasctx *ctx) {
	if (reg->specials) {
		int i = 0;
		for (i = 0; reg->specials[i].num != -1; i++) {
			if (!var_ok(reg->specials[i].fmask, 0, ctx->varinfo))
				continue;
			switch (reg->specials[i].mode) {
				case SR_NAMED:
					if (expr->type == EASM_EXPR_REG && !strcmp(expr->str, reg->specials[i].name))
						return setbf(res, reg->bf, reg->specials[i].num);
					break;
				case SR_ZERO:
					if (expr->type == EASM_EXPR_NUM && expr->num == 0)
						return setbf(res, reg->bf, reg->specials[i].num);
					break;
				case SR_ONE:
					if (expr->type == EASM_EXPR_NUM && expr->num == 1)
						return setbf(res, reg->bf, reg->specials[i].num);
					break;
				case SR_DISCARD:
					if (expr->type == EASM_EXPR_DISCARD)
						return setbf(res, reg->bf, reg->specials[i].num);
					break;
			}
		}
	}
	if (expr->type != EASM_EXPR_REG)
		return 0;
	if (strncmp(expr->str, reg->name, strlen(reg->name)))
		return 0;
	const char *str = expr->str + strlen(reg->name);
	char *end;
	ull num = strtoull(str, &end, 10);
	if (!reg->hilo) {
		if (strcmp(end, (reg->suffix?reg->suffix:"")))
			return 0;
	} else {
		if (strlen(end) != 1)
			return 0;
		if (*end != 'h' && *end != 'l')
			return 0;
		num <<= 1;
		if (*end == 'h')
			num |= 1;
	}
	if (reg->bf)
		return setbf(res, reg->bf, num);
	else
		return !num;
}